

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall pbrt::Disk::getPrimBounds(Disk *this,size_t param_2,affine3f *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar9;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  box3f *in_RDI;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar27 [16];
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  
  fVar18 = (this->transform).l.vx.x;
  fVar53 = (xfm->l).vx.z;
  uVar1 = (this->transform).l.vx.y;
  uVar10 = (this->transform).l.vx.z;
  fVar52 = (xfm->l).vy.z;
  fVar23 = (xfm->l).vz.z;
  fVar67 = (float)uVar10 * fVar23 + fVar18 * fVar53 + (float)uVar1 * fVar52;
  fVar21 = (this->transform).l.vy.x;
  uVar2 = (this->transform).l.vy.y;
  uVar11 = (this->transform).l.vy.z;
  fVar44 = fVar23 * (float)uVar11 + fVar53 * fVar21 + fVar52 * (float)uVar2;
  fVar19 = (this->transform).l.vz.x;
  uVar3 = (this->transform).l.vz.y;
  uVar12 = (this->transform).l.vz.z;
  fVar31 = fVar23 * (float)uVar12 + fVar53 * fVar19 + fVar52 * (float)uVar3;
  uVar4 = (this->transform).p.x;
  uVar13 = (this->transform).p.y;
  uVar9 = *(undefined8 *)&(this->transform).p.z;
  fVar20 = (float)uVar9;
  fVar66 = (float)((ulong)uVar9 >> 0x20);
  fVar46 = fVar66 * fVar44;
  uVar5 = (xfm->l).vx.x;
  uVar14 = (xfm->l).vx.y;
  uVar6 = (xfm->l).vy.x;
  uVar15 = (xfm->l).vy.y;
  uVar7 = (xfm->l).vz.x;
  uVar16 = (xfm->l).vz.y;
  fVar39 = (float)uVar10 * (float)uVar7 + (float)uVar1 * (float)uVar6 + fVar18 * (float)uVar5;
  fVar41 = (float)uVar10 * (float)uVar16 + (float)uVar1 * (float)uVar15 + fVar18 * (float)uVar14;
  fVar42 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar18 * 0.0;
  fVar43 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar18 * 0.0;
  fVar26 = (float)uVar11 * (float)uVar7 + (float)uVar2 * (float)uVar6 + fVar21 * (float)uVar5;
  fVar28 = (float)uVar11 * (float)uVar16 + (float)uVar2 * (float)uVar15 + fVar21 * (float)uVar14;
  fVar29 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar21 * 0.0;
  fVar30 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar21 * 0.0;
  fVar22 = -fVar66;
  fVar21 = fVar31 * 0.0;
  fVar68 = fVar67 * fVar22;
  fVar44 = fVar44 * fVar22;
  fVar47 = fVar46 + fVar68;
  fVar68 = fVar68 + fVar44;
  fVar67 = fVar67 * fVar66;
  fVar46 = fVar46 + fVar67;
  fVar18 = (xfm->p).z + fVar52 * (float)uVar13 + fVar53 * (float)uVar4 + fVar23 * fVar20;
  fVar52 = fVar68 + fVar21 + fVar18;
  fVar53 = fVar52;
  if (3.4028235e+38 <= fVar52) {
    fVar53 = 3.4028235e+38;
  }
  fVar62 = fVar66 * fVar26;
  fVar63 = fVar66 * fVar28;
  fVar64 = fVar66 * fVar29;
  fVar65 = fVar66 * fVar30;
  fVar26 = fVar26 * fVar22;
  fVar28 = fVar28 * fVar22;
  fVar29 = fVar29 * fVar22;
  fVar30 = fVar30 * fVar22;
  fVar23 = fVar22 * fVar39;
  fVar24 = fVar22 * fVar41;
  fVar25 = fVar22 * fVar42;
  fVar22 = fVar22 * fVar43;
  fVar39 = fVar39 * fVar66;
  fVar41 = fVar41 * fVar66;
  fVar42 = fVar42 * fVar66;
  fVar43 = fVar43 * fVar66;
  if (fVar52 <= -3.4028235e+38) {
    fVar52 = -3.4028235e+38;
  }
  fVar66 = this->height;
  fVar31 = fVar31 * fVar66;
  fVar68 = fVar68 + fVar31 + fVar18;
  fVar33 = fVar68;
  if (fVar53 <= fVar68) {
    fVar33 = fVar53;
  }
  if (fVar68 <= fVar52) {
    fVar68 = fVar52;
  }
  fVar53 = fVar47 + fVar21 + fVar18;
  fVar52 = fVar53;
  if (fVar33 <= fVar53) {
    fVar52 = fVar33;
  }
  if (fVar53 <= fVar68) {
    fVar53 = fVar68;
  }
  fVar47 = fVar47 + fVar31 + fVar18;
  fVar68 = fVar47;
  if (fVar52 <= fVar47) {
    fVar68 = fVar52;
  }
  if (fVar47 <= fVar53) {
    fVar47 = fVar53;
  }
  fVar67 = fVar67 + fVar44;
  fVar52 = fVar21 + fVar67 + fVar18;
  fVar53 = fVar52;
  if (fVar68 <= fVar52) {
    fVar53 = fVar68;
  }
  if (fVar52 <= fVar47) {
    fVar52 = fVar47;
  }
  fVar68 = fVar67 + fVar31 + fVar18;
  fVar67 = fVar68;
  if (fVar53 <= fVar68) {
    fVar67 = fVar53;
  }
  if (fVar68 <= fVar52) {
    fVar68 = fVar52;
  }
  fVar53 = fVar21 + fVar46 + fVar18;
  fVar52 = fVar53;
  if (fVar67 <= fVar53) {
    fVar52 = fVar67;
  }
  if (fVar53 <= fVar68) {
    fVar53 = fVar68;
  }
  fVar18 = fVar46 + fVar31 + fVar18;
  fVar31 = (float)uVar12 * (float)uVar7 + (float)uVar3 * (float)uVar6 + fVar19 * (float)uVar5;
  fVar46 = (float)uVar12 * (float)uVar16 + (float)uVar3 * (float)uVar15 + fVar19 * (float)uVar14;
  fVar47 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar19 * 0.0;
  fVar67 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar19 * 0.0;
  uVar8 = (xfm->p).x;
  uVar17 = (xfm->p).y;
  fVar35 = (float)uVar8 +
           fVar20 * (float)uVar7 + (float)uVar13 * (float)uVar6 + (float)uVar4 * (float)uVar5;
  fVar36 = (float)uVar17 +
           fVar20 * (float)uVar16 + (float)uVar13 * (float)uVar15 + (float)uVar4 * (float)uVar14;
  fVar37 = fVar20 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar38 = fVar20 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar21 = fVar31 * 0.0;
  fVar19 = fVar46 * 0.0;
  fVar20 = fVar47 * 0.0;
  fVar68 = fVar67 * 0.0;
  fVar31 = fVar66 * fVar31;
  fVar46 = fVar66 * fVar46;
  fVar47 = fVar66 * fVar47;
  fVar66 = fVar66 * fVar67;
  fVar67 = fVar23 + fVar26;
  fVar44 = fVar24 + fVar28;
  fVar33 = fVar25 + fVar29;
  fVar34 = fVar22 + fVar30;
  auVar61._0_8_ = CONCAT44(fVar44 + fVar19 + fVar36,fVar67 + fVar21 + fVar35);
  auVar61._8_4_ = fVar33 + fVar20 + fVar37;
  auVar61._12_4_ = fVar34 + fVar68 + fVar38;
  auVar48._8_4_ = auVar61._8_4_;
  auVar48._0_8_ = auVar61._0_8_;
  auVar48._12_4_ = auVar61._12_4_;
  auVar49 = minps(auVar48,_DAT_0014e7d0);
  auVar32._0_8_ = CONCAT44(fVar44 + fVar46 + fVar36,fVar67 + fVar31 + fVar35);
  auVar32._8_4_ = fVar33 + fVar47 + fVar37;
  auVar32._12_4_ = fVar34 + fVar66 + fVar38;
  auVar54._8_4_ = auVar32._8_4_;
  auVar54._0_8_ = auVar32._0_8_;
  auVar54._12_4_ = auVar32._12_4_;
  auVar55 = minps(auVar54,auVar49);
  auVar49 = maxps(auVar61,_DAT_0014a340);
  auVar32 = maxps(auVar32,auVar49);
  fVar23 = fVar23 + fVar62;
  fVar24 = fVar24 + fVar63;
  fVar25 = fVar25 + fVar64;
  fVar22 = fVar22 + fVar65;
  auVar45._0_8_ = CONCAT44(fVar24 + fVar19 + fVar36,fVar23 + fVar21 + fVar35);
  auVar45._8_4_ = fVar25 + fVar20 + fVar37;
  auVar45._12_4_ = fVar22 + fVar68 + fVar38;
  auVar50._8_4_ = auVar45._8_4_;
  auVar50._0_8_ = auVar45._0_8_;
  auVar50._12_4_ = auVar45._12_4_;
  auVar49 = minps(auVar50,auVar55);
  auVar55._0_8_ = CONCAT44(fVar24 + fVar46 + fVar36,fVar23 + fVar31 + fVar35);
  auVar55._8_4_ = fVar25 + fVar47 + fVar37;
  auVar55._12_4_ = fVar22 + fVar66 + fVar38;
  auVar56._8_4_ = auVar55._8_4_;
  auVar56._0_8_ = auVar55._0_8_;
  auVar56._12_4_ = auVar55._12_4_;
  auVar49 = minps(auVar56,auVar49);
  fVar26 = fVar26 + fVar39;
  fVar28 = fVar28 + fVar41;
  fVar29 = fVar29 + fVar42;
  fVar30 = fVar30 + fVar43;
  auVar51._0_8_ = CONCAT44(fVar28 + fVar19 + fVar36,fVar26 + fVar21 + fVar35);
  auVar51._8_4_ = fVar29 + fVar20 + fVar37;
  auVar51._12_4_ = fVar30 + fVar68 + fVar38;
  auVar59._8_4_ = auVar51._8_4_;
  auVar59._0_8_ = auVar51._0_8_;
  auVar59._12_4_ = auVar51._12_4_;
  auVar49 = minps(auVar59,auVar49);
  auVar27._0_8_ = CONCAT44(fVar28 + fVar46 + fVar36,fVar26 + fVar31 + fVar35);
  auVar27._8_4_ = fVar29 + fVar47 + fVar37;
  auVar27._12_4_ = fVar30 + fVar66 + fVar38;
  auVar57._8_4_ = auVar27._8_4_;
  auVar57._0_8_ = auVar27._0_8_;
  auVar57._12_4_ = auVar27._12_4_;
  auVar58 = minps(auVar57,auVar49);
  fVar39 = fVar39 + fVar62;
  fVar41 = fVar41 + fVar63;
  fVar42 = fVar42 + fVar64;
  fVar43 = fVar43 + fVar65;
  auVar49._0_8_ = CONCAT44(fVar19 + fVar41 + fVar36,fVar21 + fVar39 + fVar35);
  auVar49._8_4_ = fVar20 + fVar42 + fVar37;
  auVar49._12_4_ = fVar68 + fVar43 + fVar38;
  auVar60._8_4_ = auVar49._8_4_;
  auVar60._0_8_ = auVar49._0_8_;
  auVar60._12_4_ = auVar49._12_4_;
  auVar61 = minps(auVar60,auVar58);
  auVar40._0_8_ = CONCAT44(fVar41 + fVar46 + fVar36,fVar39 + fVar31 + fVar35);
  auVar40._8_4_ = fVar42 + fVar47 + fVar37;
  auVar40._12_4_ = fVar43 + fVar66 + fVar38;
  auVar58._8_4_ = auVar40._8_4_;
  auVar58._0_8_ = auVar40._0_8_;
  auVar58._12_4_ = auVar40._12_4_;
  auVar58 = minps(auVar58,auVar61);
  fVar23 = fVar18;
  if (fVar52 <= fVar18) {
    fVar23 = fVar52;
  }
  (in_RDI->lower).x = (float)(int)auVar58._0_8_;
  (in_RDI->lower).y = (float)(int)((ulong)auVar58._0_8_ >> 0x20);
  (in_RDI->lower).z = fVar23;
  auVar32 = maxps(auVar45,auVar32);
  auVar55 = maxps(auVar55,auVar32);
  auVar55 = maxps(auVar51,auVar55);
  auVar55 = maxps(auVar27,auVar55);
  auVar49 = maxps(auVar49,auVar55);
  auVar49 = maxps(auVar40,auVar49);
  if (fVar18 <= fVar53) {
    fVar18 = fVar53;
  }
  (in_RDI->upper).x = (float)(int)auVar49._0_8_;
  (in_RDI->upper).y = (float)(int)((ulong)auVar49._0_8_ >> 0x20);
  (in_RDI->upper).z = fVar18;
  return in_RDI;
}

Assistant:

box3f Disk::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius,-radius,0),vec3f(+radius,+radius,height));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }